

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O2

bool __thiscall soplex::SPxSolverBase<double>::noViols(SPxSolverBase<double> *this,double tol)

{
  double *pdVar1;
  double dVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  if (this->theType == ENTER) {
    uVar3 = (this->thecovectors->set).thenum;
    uVar5 = 0;
    uVar4 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar4 = uVar5;
    }
    do {
      bVar6 = uVar4 == uVar5;
      if (bVar6) {
        return bVar6;
      }
      dVar2 = (this->theFvec->super_VectorBase<double>).val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar5];
      if (tol < dVar2 - (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar5]) {
        return bVar6;
      }
      pdVar1 = (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + uVar5;
      uVar5 = uVar5 + 1;
    } while (*pdVar1 - dVar2 <= tol);
  }
  else {
    uVar3 = (this->thecovectors->set).thenum;
    uVar5 = 0;
    uVar4 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar4 = uVar5;
    }
    while (uVar4 != uVar5) {
      dVar2 = (this->theCoPvec->super_VectorBase<double>).val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar5];
      if ((tol < dVar2 - (this->theCoUbound->val).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar5]) ||
         (pdVar1 = (this->theCoLbound->val).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar5, uVar5 = uVar5 + 1,
         tol < *pdVar1 - dVar2)) {
        return false;
      }
    }
    uVar3 = (this->thevectors->set).thenum;
    uVar5 = 0;
    uVar4 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar4 = uVar5;
    }
    do {
      bVar6 = uVar4 == uVar5;
      if (bVar6) {
        return bVar6;
      }
      dVar2 = (this->thePvec->super_VectorBase<double>).val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar5];
      if (tol < dVar2 - (this->theUbound->val).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar5]) {
        return bVar6;
      }
      pdVar1 = (this->theLbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + uVar5;
      uVar5 = uVar5 + 1;
    } while (*pdVar1 - dVar2 <= tol);
  }
  return bVar6;
}

Assistant:

bool SPxSolverBase<R>::noViols(R tol) const
   {
      assert(tol >= R(0.0));

      if(type() == ENTER)
      {
         for(int i = 0; i < dim(); i++)
         {
            if((*theFvec)[i] - theUBbound[i] > tol)
               return false;

            if(theLBbound[i] - (*theFvec)[i] > tol)
               return false;
         }
      }
      else
      {
         assert(type() == LEAVE);

         for(int i = 0; i < dim(); i++)
         {
            if((*theCoPvec)[i] - (*theCoUbound)[i] > tol)
               return false;

            if((*theCoLbound)[i] - (*theCoPvec)[i] > tol)
               return false;
         }

         for(int i = 0; i < coDim(); i++)
         {
            if((*thePvec)[i] - (*theUbound)[i] > tol)
               return false;

            if((*theLbound)[i] - (*thePvec)[i] > tol)
               return false;
         }
      }

      return true;
   }